

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

QUuid __thiscall VcprojGenerator::getProjectUUID(VcprojGenerator *this,QString *filename)

{
  QMakeProject *pQVar1;
  undefined8 uVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  QString string;
  QUuid QVar4;
  FILE *__stream;
  Data *pDVar5;
  ProString *pPVar6;
  qsizetype qVar7;
  CutResult CVar8;
  long lVar9;
  storage_type *psVar10;
  char16_t *pcVar11;
  ProStringList *pPVar12;
  QArrayData *pQVar13;
  bool bVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QAnyStringView QVar17;
  QByteArrayView QVar18;
  undefined1 auVar19 [16];
  undefined1 *puVar20;
  QArrayData *local_148 [3];
  QString local_130;
  ProString local_118;
  QArrayDataPointer<ProString> local_e8;
  ProKey local_c8;
  ProString local_98;
  QArrayDataPointer<ProString> local_68;
  int local_48;
  short sStack_44;
  ushort uStack_42;
  byte bStack_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_c8,"GUID");
  QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_c8);
  local_118.m_string.d.d = (Data *)(long)local_98.m_offset;
  pQVar13 = (QArrayData *)(long)local_98.m_length;
  CVar8 = QtPrivate::QContainerImplHelper::mid
                    (local_98.m_string.d.size,(qsizetype *)&local_118,
                     (qsizetype *)&stack0xfffffffffffffe88);
  uVar15 = (ulong)pQVar13 | 0x8000000000000000;
  aVar3.m_data_utf16 = local_98.m_string.d.ptr + (long)local_118.m_string.d.d;
  if (CVar8 == Null) {
    uVar15 = 0x8000000000000000;
    aVar3.m_data = (void *)0x0;
  }
  QVar17.m_size = uVar15;
  QVar17.field_0.m_data = aVar3.m_data;
  auVar19 = QUuid::fromString(QVar17);
  local_48 = auVar19._0_4_;
  sStack_44 = auVar19._4_2_;
  uStack_42 = auVar19._6_2_;
  bStack_40 = auVar19[8];
  uStack_3f = auVar19._9_7_;
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar9 = 8;
  do {
    if (*(char *)((long)&local_48 + lVar9) != '\0') goto LAB_0023d76d;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  if (((local_48 == 0) && (sStack_44 == 0)) && (uStack_42 == 0)) {
    psVar10 = (storage_type *)(filename->d).size;
    puVar20 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar11 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (psVar10 != (storage_type *)0x0) goto LAB_0023d794;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_c8,"QMAKE_MAKEFILE");
    QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_c8);
    ProString::toQString((QString *)&local_68,&local_98);
    bVar14 = true;
  }
  else {
LAB_0023d76d:
    psVar10 = (storage_type *)(filename->d).size;
    if (psVar10 == (storage_type *)0x0) {
      bVar14 = false;
      goto LAB_0023d9d8;
    }
LAB_0023d794:
    puVar20 = &DAT_aaaaaaaaaaaaaaaa;
    pcVar11 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)(filename->d).d;
    local_68.ptr = (ProString *)(filename->d).ptr;
    if ((QArrayData *)local_68.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_68.d)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_68.d)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar14 = false;
    local_68.size = (qsizetype)psVar10;
  }
  local_118.m_string.d.d = (Data *)local_68.d;
  local_118.m_string.d.ptr = (char16_t *)local_68.ptr;
  local_118.m_string.d.size = local_68.size;
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  string.d.ptr = pcVar11;
  string.d.d = (Data *)pQVar13;
  string.d.size = (qsizetype)puVar20;
  Option::fixString((QString *)&stack0xfffffffffffffe88,string,(uchar)&local_118);
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar14) {
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_118.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QString *)&local_68);
  QVar18.m_data = (storage_type *)local_68.size;
  QVar18.m_size = (qsizetype)&local_118;
  QCryptographicHash::hash(QVar18,(Algorithm)local_68.ptr);
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,1,0x10);
    }
  }
  pcVar11 = local_118.m_string.d.ptr;
  if (local_118.m_string.d.ptr == (char16_t *)0x0) {
    pcVar11 = (char16_t *)&QByteArray::_empty;
  }
  uVar2 = *(undefined8 *)pcVar11;
  local_48 = (int)uVar2;
  sStack_44 = (short)((ulong)uVar2 >> 0x20);
  uStack_42 = (ushort)((ulong)uVar2 >> 0x30);
  bStack_40 = (byte)*(undefined8 *)(pcVar11 + 4);
  uStack_3f = (undefined7)((ulong)*(undefined8 *)(pcVar11 + 4) >> 8);
  lVar9 = 8;
  do {
    if (*(char *)((long)&local_48 + lVar9) != '\0') {
      bVar14 = false;
      goto LAB_0023d96a;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  bVar14 = uStack_42 == 0 && (sStack_44 == 0 && local_48 == 0);
LAB_0023d96a:
  bStack_40 = bStack_40 & 0x3f | 0x80;
  uStack_42 = uStack_42 & 0xfff | 0x3000;
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
LAB_0023d9d8:
  lVar9 = 8;
  do {
    if (*(char *)((long)&local_48 + lVar9) != '\0') {
      bVar16 = false;
      goto LAB_0023da17;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  bVar16 = false;
  if ((local_48 == 0) && (sStack_44 == 0)) {
    bVar16 = uStack_42 == 0;
  }
LAB_0023da17:
  if ((bool)(bVar14 | bVar16)) {
    auVar19 = QUuid::createUuid();
    __stream = _stderr;
    local_48 = auVar19._0_4_;
    sStack_44 = auVar19._4_2_;
    uStack_42 = auVar19._6_2_;
    bStack_40 = auVar19[8];
    uStack_3f = auVar19._9_7_;
    QUuid::toString((StringFormat)&local_68);
    QString::toUpper_helper((QString *)&stack0xfffffffffffffe88);
    QString::toLatin1_helper_inplace((QString *)&local_118);
    pcVar11 = local_118.m_string.d.ptr;
    if (local_118.m_string.d.ptr == (char16_t *)0x0) {
      pcVar11 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(__stream,
            "qmake couldn\'t create a GUID based on filepath, and we couldn\'t\nfind a valid GUID in the .pro file (Consider adding\n\'GUID = %s\'  to the .pro file)\n"
            ,pcVar11);
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
    if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QUuid::toString((StringFormat)local_148);
  QString::toUpper_helper((QString *)&local_130);
  ProString::ProString(&local_118,&local_130);
  local_e8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (ProString *)0x0;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_e8,0,&local_118);
  QList<ProString>::end((QList<ProString> *)&local_e8);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&stack0xfffffffffffffe88,"GUID");
  pPVar12 = QMakeEvaluator::valuesRef
                      (&pQVar1->super_QMakeEvaluator,(ProKey *)&stack0xfffffffffffffe88);
  qVar7 = local_e8.size;
  pPVar6 = local_e8.ptr;
  pDVar5 = local_e8.d;
  local_e8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (ProString *)0x0;
  local_68.d = (pPVar12->super_QList<ProString>).d.d;
  local_68.ptr = (pPVar12->super_QList<ProString>).d.ptr;
  (pPVar12->super_QList<ProString>).d.d = pDVar5;
  (pPVar12->super_QList<ProString>).d.ptr = pPVar6;
  local_68.size = (pPVar12->super_QList<ProString>).d.size;
  (pPVar12->super_QList<ProString>).d.size = qVar7;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_e8);
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_148[0] != (QArrayData *)0x0) {
    LOCK();
    (local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_148[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_148[0],2,0x10);
    }
  }
  QVar4.data2 = sStack_44;
  QVar4.data1 = local_48;
  QVar4.data3 = uStack_42;
  QVar4.data4[0] = bStack_40;
  QVar4.data4[1] = (undefined1)uStack_3f;
  QVar4.data4[2] = uStack_3f._1_1_;
  QVar4.data4[3] = uStack_3f._2_1_;
  QVar4.data4[4] = uStack_3f._3_1_;
  QVar4.data4[5] = uStack_3f._4_1_;
  QVar4.data4[6] = uStack_3f._5_1_;
  QVar4.data4[7] = uStack_3f._6_1_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QUuid VcprojGenerator::getProjectUUID(const QString &filename)
{
    bool validUUID = true;

    // Read GUID from variable-space
    auto uuid = QUuid::fromString(project->first("GUID").toQStringView());

    // If none, create one based on the MD5 of absolute project path
    if(uuid.isNull() || !filename.isEmpty()) {
        QString abspath = Option::fixPathToTargetOS(
                    filename.isEmpty() ? project->first("QMAKE_MAKEFILE").toQString() : filename);
        QByteArray digest = QCryptographicHash::hash(abspath.toUtf8(), QCryptographicHash::Sha1);
        memcpy((unsigned char*)(&uuid), digest.constData(), sizeof(QUuid));
        validUUID = !uuid.isNull();
        uuid.data4[0] = (uuid.data4[0] & 0x3F) | 0x80; // UV_DCE variant
        uuid.data3 = (uuid.data3 & 0x0FFF) | (QUuid::Name<<12);
    }

    // If still not valid, generate new one, and suggest adding to .pro
    if(uuid.isNull() || !validUUID) {
        uuid = QUuid::createUuid();
        fprintf(stderr,
                "qmake couldn't create a GUID based on filepath, and we couldn't\nfind a valid GUID in the .pro file (Consider adding\n'GUID = %s'  to the .pro file)\n",
                uuid.toString().toUpper().toLatin1().constData());
    }

    // Store GUID in variable-space
    project->values("GUID") = ProStringList(uuid.toString().toUpper());
    return uuid;
}